

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportText.cpp
# Opt level: O2

string * __thiscall
oout::FmtText::success(string *__return_storage_ptr__,FmtText *this,string *text)

{
  ostream *poVar1;
  ostringstream out;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,(string *)text);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"[       OK ] ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string success(const string &text) const override
	{
		ostringstream out;
		out << text << endl << "[       OK ] ";
		return out.str();
	}